

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

FMformat_order FMformat_cmp(FMFormat_conflict format1,FMFormat_conflict format2)

{
  char *pcVar1;
  char *__s2;
  FMFormat_conflict format1_00;
  char **ppcVar2;
  FMformat_order FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FMformat_order FVar7;
  FMFieldList list;
  FMFieldList list_00;
  FMFieldList p_Var8;
  long lVar9;
  FMFormat_conflict *__ptr;
  FMFormat_conflict *__ptr_00;
  int iVar10;
  FMFormat_conflict format2_00;
  long lVar11;
  FMFormat_conflict *pp_Var12;
  size_t __nmemb;
  size_t __nmemb_00;
  FMFormat_conflict *pp_Var13;
  FMFieldList p_Var14;
  bool bVar15;
  FMformat_order local_84;
  
  list = copy_field_list(format1->field_list);
  list_00 = copy_field_list(format2->field_list);
  __nmemb_00 = 0xffffffffffffffff;
  p_Var8 = list;
  do {
    __nmemb_00 = __nmemb_00 + 1;
    ppcVar2 = &p_Var8->field_name;
    p_Var8 = p_Var8 + 1;
  } while (*ppcVar2 != (char *)0x0);
  __nmemb = 0xffffffffffffffff;
  p_Var8 = list_00;
  do {
    __nmemb = __nmemb + 1;
    ppcVar2 = &p_Var8->field_name;
    p_Var8 = p_Var8 + 1;
  } while (*ppcVar2 != (char *)0x0);
  qsort(list,__nmemb_00,0x18,field_name_compar);
  qsort(list_00,__nmemb,0x18,field_name_compar);
  local_84 = Format_Equal;
  iVar5 = 0;
  iVar10 = 0;
  do {
    if (((int)__nmemb_00 <= iVar5) || ((int)__nmemb <= iVar10)) {
      if (iVar5 < (int)__nmemb_00) {
        bVar15 = local_84 == Format_Less;
        local_84 = Format_Greater;
        if (bVar15) {
          local_84 = Format_Incompatible;
          goto LAB_0011d72d;
        }
      }
      else if (iVar10 < (int)__nmemb) {
        if (local_84 == Format_Greater) {
          local_84 = Format_Incompatible;
          goto LAB_0011d72d;
        }
        local_84 = Format_Less;
      }
      __ptr = get_subformats_IOformat(format1);
      __ptr_00 = get_subformats_IOformat(format2);
      format1_00 = *__ptr;
      pp_Var12 = __ptr;
      goto joined_r0x0011d7c5;
    }
    lVar11 = (long)iVar5;
    p_Var8 = list + lVar11;
    pcVar1 = list[lVar11].field_name;
    lVar9 = (long)iVar10;
    p_Var14 = list_00 + lVar9;
    __s2 = list_00[lVar9].field_name;
    iVar4 = strcmp(pcVar1,__s2);
    if (iVar4 == 0) {
      iVar4 = field_type_eq(p_Var8->field_type,p_Var14->field_type);
      if (iVar4 == 0) {
        iVar6 = 1;
      }
      else {
LAB_0011d712:
        iVar5 = iVar5 + 1;
        iVar10 = iVar10 + 1;
        iVar6 = 0;
      }
    }
    else {
      iVar6 = 10;
      if (iVar4 < 0) {
        if (local_84 == Format_Less) {
LAB_0011d682:
          local_84 = Format_Incompatible;
          goto LAB_0011d719;
        }
        lVar9 = 0;
        do {
          iVar4 = strcmp(p_Var8->field_name,__s2);
          if (-1 < iVar4) {
            iVar5 = ~(uint)lVar9 + iVar5;
            iVar10 = iVar10 + -1;
            local_84 = Format_Greater;
            goto LAB_0011d712;
          }
          lVar9 = lVar9 + -1;
          p_Var8 = p_Var8 + 1;
        } while (lVar11 - __nmemb_00 != lVar9);
        iVar5 = iVar5 - (int)lVar9;
      }
      else {
        if (local_84 == Format_Greater) goto LAB_0011d682;
        lVar11 = 0;
        do {
          iVar4 = strcmp(pcVar1,p_Var14->field_name);
          if (iVar4 < 1) {
            iVar5 = iVar5 + -1;
            iVar10 = ~(uint)lVar11 + iVar10;
            local_84 = Format_Less;
            goto LAB_0011d712;
          }
          lVar11 = lVar11 + -1;
          p_Var14 = p_Var14 + 1;
        } while (lVar9 - __nmemb != lVar11);
        iVar10 = iVar10 - (int)lVar11;
      }
      local_84 = Format_Incompatible;
      iVar6 = 10;
    }
LAB_0011d719:
  } while (iVar6 == 0);
  if (iVar6 == 10) {
LAB_0011d72d:
    __ptr_00 = (FMFormat_conflict *)0x0;
    __ptr = (FMFormat_conflict *)0x0;
LAB_0011d72f:
    free_field_list(list);
    free_field_list(list_00);
    if (__ptr != (FMFormat_conflict *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (FMFormat_conflict *)0x0) {
      free(__ptr_00);
    }
  }
  else {
LAB_0011d896:
    local_84 = Format_Incompatible;
  }
  return local_84;
joined_r0x0011d7c5:
  if (format1_00 == (FMFormat_conflict)0x0) goto LAB_0011d72f;
  if (format1_00 == format1) {
    pp_Var12 = pp_Var12 + 1;
    iVar5 = 0xf;
  }
  else {
    format2_00 = *__ptr_00;
    if (format2_00 != (FMFormat_conflict)0x0) {
      pcVar1 = format1_00->format_name;
      pp_Var13 = __ptr_00;
      do {
        pp_Var13 = pp_Var13 + 1;
        iVar5 = strcmp(pcVar1,format2_00->format_name);
        if (iVar5 == 0) {
          FVar7 = FMformat_cmp(format1_00,format2_00);
          FVar3 = local_84;
          if (FVar7 == Format_Equal) {
LAB_0011d874:
            local_84 = FVar3;
            iVar5 = 0x12;
            bVar15 = true;
          }
          else {
            iVar5 = 10;
            if (FVar7 != Format_Incompatible) {
              FVar3 = FVar7;
              if ((local_84 == Format_Equal) || (FVar3 = local_84, local_84 == FVar7))
              goto LAB_0011d874;
              FVar7 = Format_Incompatible;
            }
            local_84 = FVar7;
            bVar15 = false;
          }
          if (!bVar15) goto LAB_0011d82d;
          break;
        }
        format2_00 = *pp_Var13;
      } while (format2_00 != (FMFormat_conflict)0x0);
    }
    pp_Var12 = pp_Var12 + 1;
    iVar5 = 0;
  }
LAB_0011d82d:
  if ((iVar5 != 0) && (iVar5 != 0xf)) {
    if (iVar5 != 10) goto LAB_0011d896;
    goto LAB_0011d72f;
  }
  format1_00 = *pp_Var12;
  goto joined_r0x0011d7c5;
}

Assistant:

FMformat_order
FMformat_cmp(FMFormat format1, FMFormat format2)
{
    FMformat_order tmp_result = Format_Equal;
    FMFieldList field_list1 =
	copy_field_list(field_list_of_IOformat(format1));
    FMFieldList field_list2 =
	copy_field_list(field_list_of_IOformat(format2));
    FMFormat *subformats1 = NULL, *subformats2 = NULL, *tmp_subformats = NULL;
    int field_count1, field_count2;
    int i, j, limit;

    /* count fields */
    for (field_count1 = 0; field_list1[field_count1].field_name != NULL;
	 field_count1++);

    /* count fields */
    for (field_count2 = 0; field_list2[field_count2].field_name != NULL;
	 field_count2++);

    qsort(field_list1, field_count1, sizeof(FMField), field_name_compar);
    qsort(field_list2, field_count2, sizeof(FMField), field_name_compar);

    limit = field_count1;
    if (field_count2 < limit)
	limit = field_count2;
    i = j = 0;
    while ((i < field_count1) && (j < field_count2)) {
	int name_cmp;
	if ((name_cmp = strcmp(field_list1[i].field_name,
			       field_list2[j].field_name)) == 0) {
	    /* fields have same name */
	    if (!field_type_eq(field_list1[i].field_type,
				  field_list2[j].field_type)) {
		return Format_Incompatible;
	    }
	} else if (name_cmp < 0) {
	    /* name_cmp>0  a field in field_list1 that doesn't appear in 2 */
	    if (tmp_result == Format_Less) {
		/* we previously found the opposite */
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		/* tentatively decide that list1 is a superset of 2 */
		tmp_result = Format_Greater;
	    }
	    /* skip fields in 1 until we find the next field in 2 */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) < 0) {
		i++;
		if (i == field_count1) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	} else {
	    /* name_cmp>0  a field in field_list2 that doesn't appear in 1 */
	    if (tmp_result == Format_Greater) {
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		tmp_result = Format_Less;
	    }
	    /* skip fields in field_list2 until we find matching */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) > 0) {
		j++;
		if (j == field_count2) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	}
	i++;
	j++;
    }
    if (i < field_count1) {
	if (tmp_result == Format_Less) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Greater;
	}
    } else if (j < field_count2) {
	if (tmp_result == Format_Greater) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Less;
	}
    }
    /* go through subformats */
    tmp_subformats = subformats1 = get_subformats_IOformat(format1);
    subformats2 = get_subformats_IOformat(format2);

    while (*subformats1 != NULL) {
	char *sub1_name = name_of_FMformat(*subformats1);
	int i = 0;
	if (*subformats1 == format1) {
	    /* self appears in subformat list, skip it */
	    subformats1++;
	    continue;
	}
	while (subformats2[i] != NULL) {
	    if (strcmp(sub1_name, name_of_FMformat(subformats2[i])) == 0) {
		/* same name, compare */
		FMformat_order sub_result;
		sub_result = FMformat_cmp(*subformats1,
					  subformats2[i]);
		if (sub_result == Format_Incompatible) {
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
		if (sub_result != Format_Equal) {
		    /* subformats are not equal! */
		    if (tmp_result == Format_Equal) {
			/* we thought they were equal before */
			tmp_result = sub_result;
		    } else if (tmp_result != sub_result) {
			tmp_result = Format_Incompatible;
			goto free_lists;
		    }
		}
		break;
	    }
	    i++;
	}
	subformats1++;
    }

 free_lists:
    free_field_list(field_list1);
    free_field_list(field_list2);
    if (tmp_subformats) free(tmp_subformats);
    if (subformats2) free(subformats2);
    return tmp_result;
}